

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_pgroup_create(Integer *list,Integer count)

{
  int iVar1;
  proc_list_t *ppVar2;
  void *__ptr;
  int *pid_list;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  proc_list_t *ppVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Integer IVar11;
  Integer local_58;
  
  local_58 = GAnproc;
  __ptr = malloc(GAnproc * 8);
  pid_list = (int *)malloc(local_58 * 4);
  piVar4 = &PGRP_LIST->actv;
  uVar5 = 0xffffffffffffffff;
  do {
    iVar1 = *piVar4;
    uVar9 = uVar5 + 1;
    if (iVar1 == 0) break;
    lVar6 = uVar5 + 2;
    piVar4 = piVar4 + 10;
    uVar5 = uVar9;
  } while (lVar6 < _max_global_array);
  if (iVar1 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
    local_58 = GAnproc;
  }
  uVar9 = -(ulong)(iVar1 != 0) | uVar9;
  lVar6 = 0;
  lVar3 = 0;
  if (0 < count) {
    lVar3 = count;
  }
  while (lVar8 = lVar6, IVar11 = GAnproc, lVar8 != lVar3) {
    lVar6 = list[lVar8];
    if ((lVar6 < 0) || (local_58 <= lVar6)) {
      pnga_error(" invalid element in list ",lVar6);
    }
    for (lVar10 = lVar8 + 1; lVar6 = lVar8 + 1, lVar10 < count; lVar10 = lVar10 + 1) {
      if (list[lVar8] == list[lVar10]) {
        pnga_error(" Duplicate elements in list ",list[lVar8]);
      }
    }
  }
  piVar4 = (int *)malloc(GAnproc * 8);
  PGRP_LIST[uVar9].map_proc_list = piVar4;
  PGRP_LIST[uVar9].inv_map_proc_list = PGRP_LIST[uVar9].map_proc_list + IVar11;
  ppVar7 = PGRP_LIST + uVar9;
  lVar6 = 0;
  if (IVar11 < 1) {
    IVar11 = lVar6;
  }
  for (; IVar11 != lVar6; lVar6 = lVar6 + 1) {
    ppVar7->map_proc_list[lVar6] = -1;
  }
  ppVar7 = PGRP_LIST + uVar9;
  for (lVar6 = 0; IVar11 != lVar6; lVar6 = lVar6 + 1) {
    ppVar7->inv_map_proc_list[lVar6] = -1;
  }
  for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
    pid_list[lVar6] = (int)list[lVar6];
  }
  lVar6 = 1;
  do {
    ppVar7 = PGRP_LIST;
    if (count <= lVar6) {
      if ((long)GA_Default_Proc_Group == -1) {
        for (lVar6 = 0; ppVar7 = PGRP_LIST, lVar3 != lVar6; lVar6 = lVar6 + 1) {
          *(long *)((long)__ptr + lVar6 * 8) = (long)pid_list[lVar6];
        }
      }
      else {
        ppVar2 = PGRP_LIST + GA_Default_Proc_Group;
        for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
          *(long *)((long)__ptr + lVar6 * 8) = (long)ppVar2->inv_map_proc_list[pid_list[lVar6]];
        }
      }
      for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
        lVar8 = *(long *)((long)__ptr + lVar6 * 8);
        ppVar7[uVar9].map_proc_list[lVar8] = (int)lVar6;
        ppVar7[uVar9].inv_map_proc_list[lVar6] = (int)lVar8;
      }
      ppVar7 = ppVar7 + uVar9;
      ppVar7->actv = 1;
      ppVar7->parent = GA_Default_Proc_Group;
      ppVar7->mirrored = 0;
      ppVar7->map_nproc = (int)count;
      ARMCI_Group_create((int)count,pid_list,&ppVar7->group);
      free(__ptr);
      free(pid_list);
      return uVar9;
    }
    iVar1 = pid_list[lVar6];
    for (lVar8 = lVar6; 0 < lVar8; lVar8 = lVar8 + -1) {
      if (pid_list[lVar8 + -1] <= iVar1) goto LAB_001bcdc6;
      pid_list[lVar8] = pid_list[lVar8 + -1];
    }
    lVar8 = 0;
LAB_001bcdc6:
    pid_list[lVar8] = iVar1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Integer pnga_pgroup_create(Integer *list, Integer count)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    Integer parent;
    int tmp_count;
    Integer *tmp_list;
    int *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
 

    /* Allocate temporary arrays */
    tmp_list = (Integer*)malloc(GAnproc*sizeof(Integer));
    tmp2_list = (int*)malloc(GAnproc*sizeof(int));

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Check list for validity (no duplicates and no out of range entries) */
    nprocs = GAnproc;
    for (i=0; i<count; i++) {
       if (list[i] <0 || list[i] >= nprocs)
	  pnga_error(" invalid element in list ", list[i]);
       for (j=i+1; j<count; j++) {
	  if (list[i] == list[j])
	     pnga_error(" Duplicate elements in list ", list[i]);
       }
    }
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    
    for (i=0; i<count; i++) {
       tmp2_list[i] = (int)list[i];
    }
    
    /* use a simple sort routine to reorder list into assending order */
    for (j=1; j<count; j++) {
       itmp = tmp2_list[j];
       i = j-1;
       while(i>=0  && tmp2_list[i] > itmp) {
          tmp2_list[i+1] = tmp2_list[i];
          i--;
       }
       tmp2_list[i+1] = itmp;
    }
    
    /* Remap elements in list to absolute processor indices (if necessary)*/
    if (GA_Default_Proc_Group != -1) {
       parent = GA_Default_Proc_Group;
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].inv_map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)tmp2_list[i];
       }
    }
    
    tmp_count = (int)(count);
    /* Create proc list maps */
    for (i=0; i<count; i++) {
       j = tmp_list[i];
       PGRP_LIST[pgrp_handle].map_proc_list[j] = i;
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = j;
    }
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = GA_Default_Proc_Group;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp2_list, &PGRP_LIST[pgrp_handle].group);
#endif

    /* Clean up temporary arrays */
    free(tmp_list);
    free(tmp2_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}